

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

int P_Thing_CheckProximity
              (AActor *self,PClass *classname,double distance,int count,int flags,int ptr,
              bool counting)

{
  bool bVar1;
  uint uVar2;
  AActor *this;
  MetaClass *pMVar3;
  double dVar4;
  double dVar5;
  uint local_c8;
  TFlags<ActorFlag6,_unsigned_int> local_98;
  TFlags<ActorFlag,_unsigned_int> local_94;
  AActor *local_90;
  AActor *dist;
  AActor *mo;
  TThinkerIterator<AActor> it;
  bool ptrDistPref;
  bool ptrWillChange;
  double current;
  double farther;
  double closer;
  int result;
  int counter;
  AActor *ref;
  bool counting_local;
  int ptr_local;
  int flags_local;
  int count_local;
  double distance_local;
  PClass *classname_local;
  AActor *self_local;
  
  this = COPY_AAPTR(self,ptr);
  if (((this == (AActor *)0x0) || (classname == (PClass *)0x0)) || (distance <= 0.0)) {
    return 0;
  }
  closer._4_4_ = 0;
  closer._0_4_ = 0;
  current = 0.0;
  it.super_FThinkerIterator._23_1_ = (flags & 0x1c0U) != 0;
  it.super_FThinkerIterator._22_1_ = (flags & 0x600U) != 0;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
  local_90 = (AActor *)0x0;
  farther = distance;
LAB_0060a34f:
  do {
    do {
      dist = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false);
      if (dist == (AActor *)0x0) {
LAB_0060a637:
        if (((it.super_FThinkerIterator._23_1_ & 1) != 0) && (local_90 != (AActor *)0x0)) {
          if ((flags & 0x800U) == 0) {
            if ((flags & 0x40U) != 0) {
              TObjPtr<AActor>::operator=(&self->target,local_90);
            }
            if ((flags & 0x80U) != 0) {
              TObjPtr<AActor>::operator=(&self->master,local_90);
            }
            if ((flags & 0x100U) != 0) {
              TObjPtr<AActor>::operator=(&self->tracer,local_90);
            }
          }
          else {
            if ((flags & 0x40U) != 0) {
              TObjPtr<AActor>::operator=(&this->target,local_90);
            }
            if ((flags & 0x80U) != 0) {
              TObjPtr<AActor>::operator=(&this->master,local_90);
            }
            if ((flags & 0x100U) != 0) {
              TObjPtr<AActor>::operator=(&this->tracer,local_90);
            }
          }
        }
        if (!counting) {
          if (closer._4_4_ == count) {
            closer._0_4_ = 1;
          }
          else if ((int)closer._4_4_ < count) {
            closer._0_4_ = (uint)((flags & 2U) != 0 && (flags & 0x20U) == 0);
          }
        }
        if (counting) {
          local_c8 = closer._4_4_;
        }
        else {
          local_c8 = closer._0_4_;
        }
        return local_c8;
      }
    } while (dist == this);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_94,
               (int)dist +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_94);
  } while (uVar2 != 0);
  if ((flags & 1U) == 0) {
    pMVar3 = AActor::GetClass(dist);
    if ((MetaClass *)classname != pMVar3) goto LAB_0060a34f;
  }
  else {
    bVar1 = DObject::IsKindOf((DObject *)dist,classname);
    if (!bVar1) goto LAB_0060a34f;
  }
  dVar4 = AActor::Distance2D(this,dist,false);
  if (dVar4 < distance) {
    if ((flags & 4U) == 0) {
      dVar4 = AActor::Z(this);
      dVar5 = AActor::Z(dist);
      if (dVar5 < dVar4) {
        dVar4 = AActor::Z(this);
        dVar5 = AActor::Top(dist);
        if (dVar4 - dVar5 < distance) goto LAB_0060a4da;
      }
      dVar4 = AActor::Z(this);
      dVar5 = AActor::Z(dist);
      if (dVar5 < dVar4) goto LAB_0060a34f;
      dVar4 = AActor::Z(dist);
      dVar5 = AActor::Top(this);
      if (distance <= dVar4 - dVar5) goto LAB_0060a34f;
    }
LAB_0060a4da:
    if (((flags & 0x1000U) == 0) || (bVar1 = P_CheckSight(dist,this,9), bVar1)) {
      if ((it.super_FThinkerIterator._23_1_ & 1) != 0) {
        dVar4 = AActor::Distance2D(this,dist,false);
        if (((flags & 0x400U) == 0) || (farther <= dVar4)) {
          if (((flags & 0x200U) == 0) || (dVar4 <= current)) {
            if (local_90 == (AActor *)0x0) {
              local_90 = dist;
            }
          }
          else {
            local_90 = dist;
            current = dVar4;
          }
        }
        else {
          local_90 = dist;
          farther = dVar4;
        }
      }
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_98,
                 (int)dist + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_98);
      if (uVar2 == 0) {
        if ((flags & 0x10U) != 0) goto LAB_0060a34f;
      }
      else if ((flags & 0x18U) == 0) goto LAB_0060a34f;
      closer._4_4_ = closer._4_4_ + 1;
      if (((!counting) && (count < (int)closer._4_4_)) &&
         ((closer._0_4_ = (uint)((flags & 0x22U) == 0), (it.super_FThinkerIterator._23_1_ & 1) == 0
          || ((it.super_FThinkerIterator._22_1_ & 1) == 0)))) goto LAB_0060a637;
    }
  }
  goto LAB_0060a34f;
}

Assistant:

int P_Thing_CheckProximity(AActor *self, PClass *classname, double distance, int count, int flags, int ptr, bool counting)
{
	AActor *ref = COPY_AAPTR(self, ptr);

	// We need these to check out.
	if (!ref || !classname || distance <= 0)
		return 0;
	
	int counter = 0;
	int result = 0;
	double closer = distance, farther = 0, current = distance;
	const bool ptrWillChange = !!(flags & (CPXF_SETTARGET | CPXF_SETMASTER | CPXF_SETTRACER));
	const bool ptrDistPref = !!(flags & (CPXF_CLOSEST | CPXF_FARTHEST));

	TThinkerIterator<AActor> it;
	AActor *mo, *dist = nullptr;

	// [MC] Process of elimination, I think, will get through this as quickly and 
	// efficiently as possible. 
	while ((mo = it.Next()))
	{
		if (mo == ref) //Don't count self.
			continue;

		// no unmorphed versions of currently morphed players.
		if (mo->flags & MF_UNMORPHED)
			continue;

		// Check inheritance for the classname. Taken partly from CheckClass DECORATE function.
		if (flags & CPXF_ANCESTOR)
		{
			if (!(mo->IsKindOf(classname)))
				continue;
		}
		// Otherwise, just check for the regular class name.
		else if (classname != mo->GetClass())
			continue;

		// [MC]Make sure it's in range and respect the desire for Z or not. The function forces it to use
		// Z later for ensuring CLOSEST and FARTHEST flags are respected perfectly.
		// Ripped from sphere checking in A_RadiusGive (along with a number of things).
		if ((ref->Distance2D(mo) < distance &&
			((flags & CPXF_NOZ) ||
			((ref->Z() > mo->Z() && ref->Z() - mo->Top() < distance) ||
			(ref->Z() <= mo->Z() && mo->Z() - ref->Top() < distance)))))
		{
			if ((flags & CPXF_CHECKSIGHT) && !(P_CheckSight(mo, ref, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY)))
				continue;

			if (ptrWillChange)
			{
				current = ref->Distance2D(mo);

				if ((flags & CPXF_CLOSEST) && (current < closer))
				{
					dist = mo;
					closer = current; // This actor's closer. Set the new standard.
				}
				else if ((flags & CPXF_FARTHEST) && (current > farther))
				{
					dist = mo;
					farther = current;
				}
				else if (!dist)
					dist = mo; // Just get the first one and call it quits if there's nothing selected.
			}
			if (mo->flags6 & MF6_KILLED)
			{
				if (!(flags & (CPXF_COUNTDEAD | CPXF_DEADONLY)))
					continue;
			}
			else
			{
				if (flags & CPXF_DEADONLY)
					continue;
			}
			counter++;

			// Abort if the number of matching classes nearby is greater, we have obviously succeeded in our goal.
			// Don't abort if calling the counting version CheckProximity non-action function.
			if (!counting && counter > count)
			{					
				result = (flags & (CPXF_LESSOREQUAL | CPXF_EXACT)) ? 0 : 1;

				// However, if we have one SET* flag and either the closest or farthest flags, keep the function going.
				if (ptrWillChange && ptrDistPref)
					continue;
				else
					break;
			}
		}
	}

	if (ptrWillChange && dist != 0)
	{
		if (flags & CPXF_SETONPTR)
		{
			if (flags & CPXF_SETTARGET)		ref->target = dist;
			if (flags & CPXF_SETMASTER)		ref->master = dist;
			if (flags & CPXF_SETTRACER)		ref->tracer = dist;
		}
		else
		{
			if (flags & CPXF_SETTARGET)		self->target = dist;
			if (flags & CPXF_SETMASTER)		self->master = dist;
			if (flags & CPXF_SETTRACER)		self->tracer = dist;
		}
	}

	if (!counting)
	{
		if (counter == count)
			result = 1;
		else if (counter < count)
			result = !!((flags & CPXF_LESSOREQUAL) && !(flags & CPXF_EXACT)) ? 1 : 0;
	}
	return counting ? counter : result;
}